

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O0

int EmitAlphaRGB(VP8Io *io,WebPDecParams *p,int expected_num_lines_out)

{
  int iVar1;
  uint8_t *puVar2;
  long *in_RSI;
  VP8Io *in_RDI;
  int has_alpha;
  uint8_t *dst;
  uint8_t *base_rgba;
  int start_y;
  int num_rows;
  WebPRGBABuffer *buf;
  int alpha_first;
  WEBP_CSP_MODE colorspace;
  int mb_w;
  uint8_t *alpha;
  bool local_55;
  int local_3c;
  long *local_38;
  uint local_2c;
  WEBP_CSP_MODE local_28;
  int local_24;
  uint8_t *local_20 [3];
  VP8Io *local_8;
  
  local_20[0] = in_RDI->a;
  if (local_20[0] != (uint8_t *)0x0) {
    local_24 = in_RDI->mb_w;
    local_28 = *(WEBP_CSP_MODE *)*in_RSI;
    local_55 = local_28 == MODE_ARGB || local_28 == MODE_Argb;
    local_2c = (uint)local_55;
    local_38 = (long *)(*in_RSI + 0x10);
    local_8 = in_RDI;
    iVar1 = GetAlphaSourceRow(in_RDI,local_20,&local_3c);
    puVar2 = (uint8_t *)(*local_38 + (long)iVar1 * (long)(int)local_38[1]);
    iVar1 = 3;
    if (local_2c != 0) {
      iVar1 = 0;
    }
    iVar1 = (*WebPDispatchAlpha)
                      (local_20[0],local_8->width,local_24,local_3c,puVar2 + iVar1,(int)local_38[1])
    ;
    if ((iVar1 != 0) && (iVar1 = WebPIsPremultipliedMode(local_28), iVar1 != 0)) {
      (*WebPApplyAlphaMultiply)(puVar2,local_2c,local_24,local_3c,(int)local_38[1]);
    }
  }
  return 0;
}

Assistant:

static int EmitAlphaRGB(const VP8Io* const io, WebPDecParams* const p,
                        int expected_num_lines_out) {
  const uint8_t* alpha = io->a;
  if (alpha != NULL) {
    const int mb_w = io->mb_w;
    const WEBP_CSP_MODE colorspace = p->output->colorspace;
    const int alpha_first =
        (colorspace == MODE_ARGB || colorspace == MODE_Argb);
    const WebPRGBABuffer* const buf = &p->output->u.RGBA;
    int num_rows;
    const int start_y = GetAlphaSourceRow(io, &alpha, &num_rows);
    uint8_t* const base_rgba = buf->rgba + (ptrdiff_t)start_y * buf->stride;
    uint8_t* const dst = base_rgba + (alpha_first ? 0 : 3);
    const int has_alpha = WebPDispatchAlpha(alpha, io->width, mb_w,
                                            num_rows, dst, buf->stride);
    (void)expected_num_lines_out;
    assert(expected_num_lines_out == num_rows);
    // has_alpha is true if there's non-trivial alpha to premultiply with.
    if (has_alpha && WebPIsPremultipliedMode(colorspace)) {
      WebPApplyAlphaMultiply(base_rgba, alpha_first,
                             mb_w, num_rows, buf->stride);
    }
  }
  return 0;
}